

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall
wallet::SQLiteBatch::WriteKey(SQLiteBatch *this,DataStream *key,DataStream *value,bool overwrite)

{
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  ConstevalFormatString<2U> fmt;
  string_view source_file;
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  byte in_CL;
  void *__stat_loc;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000050;
  char (*in_stack_00000060) [9];
  char **in_stack_00000068;
  int res;
  sqlite3_stmt *stmt;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  Span<const_std::byte> *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  allocator<char> *in_stack_fffffffffffffee8;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 uVar5;
  sqlite3_stmt *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  LogFlags LVar6;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool bVar7;
  char *in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  allocator<char> local_71 [24];
  allocator<char> local_59 [81];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RDI + HTTP) + 200) == 0) {
    bVar7 = false;
  }
  else {
    uVar5 = false;
    if (*(long *)(in_RDI + ZMQ) != 0) {
      uVar5 = *(long *)(in_RDI + (ZMQ|HTTP)) != 0;
    }
    if ((bool)uVar5 == false) {
      __assert_fail("m_insert_stmt && m_overwrite_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1e6,
                    "virtual bool wallet::SQLiteBatch::WriteKey(DataStream &&, DataStream &&, bool)"
                   );
    }
    if ((in_CL & 1) == 0) {
      local_d0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (in_RDI + ZMQ);
    }
    else {
      local_d0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (in_RDI + (ZMQ|HTTP));
    }
    this_00 = local_d0;
    LVar6 = in_RDI;
    Span<const_std::byte>::Span<DataStream>
              (in_stack_fffffffffffffeb8,(DataStream *)in_stack_fffffffffffffeb0,
               (type)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffef7,
                                        CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0
                                                )),in_stack_fffffffffffffee8);
    blob.m_size._0_7_ = in_stack_ffffffffffffff58;
    blob.m_data = (byte *)LVar6;
    blob.m_size._7_1_ = in_stack_ffffffffffffff5f;
    uVar1 = BindBlobToStatement(in_stack_ffffffffffffff18,(int)((ulong)in_RDI >> 0x20),blob,
                                (string *)CONCAT17(uVar5,in_stack_ffffffffffffff08));
    bVar2 = uVar1 ^ 0xff;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    std::allocator<char>::~allocator(local_59);
    if ((bVar2 & 1) == 0) {
      Span<const_std::byte>::Span<DataStream>
                (in_stack_fffffffffffffeb8,(DataStream *)in_stack_fffffffffffffeb0,
                 (type)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      __a = local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_fffffffffffffef0)),__a);
      __stat_loc = (void *)0x2;
      blob_00.m_size._0_7_ = in_stack_ffffffffffffff58;
      blob_00.m_data = (byte *)LVar6;
      blob_00.m_size._7_1_ = in_stack_ffffffffffffff5f;
      bVar7 = BindBlobToStatement(in_stack_ffffffffffffff18,(int)((ulong)in_RDI >> 0x20),blob_00,
                                  (string *)CONCAT17(uVar5,in_stack_ffffffffffffff08));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::allocator<char>::~allocator(local_71);
      if (((bVar7 ^ 0xffU) & 1) == 0) {
        if ((*(byte *)(in_RDI + WALLETDB) & 1) == 0) {
          CSemaphore::wait((CSemaphore *)(*(long *)(in_RDI + HTTP) + 0x68),__stat_loc);
        }
        iVar3 = sqlite3_step(local_d0);
        sqlite3_clear_bindings(local_d0);
        sqlite3_reset(local_d0);
        if (iVar3 != 0x65) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          in_stack_fffffffffffffeb0 = "%s: Unable to execute statement: %s\n";
          sVar4 = sqlite3_errstr(iVar3);
          source_file._M_str = in_stack_ffffffffffffff68;
          source_file._M_len = sVar4;
          fmt.fmt._7_1_ = in_stack_ffffffffffffff5f;
          fmt.fmt._0_7_ = in_stack_ffffffffffffff58;
          LogPrintFormatInternal<char[9],char_const*>
                    (in_stack_ffffffffffffff70,source_file,
                     (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),in_RDI,in_stack_00000050,fmt,
                     in_stack_00000060,in_stack_00000068);
        }
        if ((*(byte *)(in_RDI + WALLETDB) & 1) == 0) {
          CSemaphore::post((CSemaphore *)in_stack_fffffffffffffeb0);
        }
        bVar7 = iVar3 == 0x65;
      }
      else {
        bVar7 = false;
      }
    }
    else {
      bVar7 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::WriteKey(DataStream&& key, DataStream&& value, bool overwrite)
{
    if (!m_database.m_db) return false;
    assert(m_insert_stmt && m_overwrite_stmt);

    sqlite3_stmt* stmt;
    if (overwrite) {
        stmt = m_overwrite_stmt;
    } else {
        stmt = m_insert_stmt;
    }

    // Bind: leftmost parameter in statement is index 1
    // Insert index 1 is key, 2 is value
    if (!BindBlobToStatement(stmt, 1, key, "key")) return false;
    if (!BindBlobToStatement(stmt, 2, value, "value")) return false;

    // Acquire semaphore if not previously acquired when creating a transaction.
    if (!m_txn) m_database.m_write_semaphore.wait();

    // Execute
    int res = sqlite3_step(stmt);
    sqlite3_clear_bindings(stmt);
    sqlite3_reset(stmt);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
    }

    if (!m_txn) m_database.m_write_semaphore.post();

    return res == SQLITE_DONE;
}